

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O2

void __thiscall
ConfidentialTxIn_EstimateTxInSize_Test::TestBody(ConfidentialTxIn_EstimateTxInSize_Test *this)

{
  AddressType addr_type;
  uint32_t pegin_btc_tx_size;
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  Script *scriptsig_template;
  pointer pTVar6;
  initializer_list<TestEstimateConfidentialTxInSizeVector> __l;
  AssertHelper local_b78;
  uint32_t cache_size;
  uint32_t wit_size;
  uint32_t size;
  allocator_type local_b62;
  allocator local_b61;
  allocator local_b60;
  allocator local_b5f;
  allocator local_b5e;
  allocator local_b5d;
  allocator local_b5c;
  allocator local_b5b;
  allocator local_b5a;
  allocator local_b59;
  AssertHelper local_b58;
  AssertionResult gtest_ar;
  Script local_b20;
  Script local_ae8;
  Script script_template;
  Script local_a60;
  undefined2 local_a28;
  bool local_a26;
  string local_a20 [32];
  undefined8 local_a00;
  uint32_t local_9f8;
  undefined8 local_9f0;
  undefined4 local_9e8;
  Script local_9e0;
  undefined4 local_9a8;
  Script local_9a0;
  undefined2 local_968;
  undefined1 local_966;
  string local_960 [32];
  undefined8 local_940;
  undefined4 local_938;
  undefined8 local_930;
  undefined4 local_928;
  Script local_920;
  undefined4 local_8e8;
  Script local_8e0;
  undefined2 local_8a8;
  undefined1 local_8a6;
  string local_8a0 [32];
  undefined8 local_880;
  undefined4 local_878;
  undefined8 local_870;
  undefined4 local_868;
  Script local_860;
  undefined4 local_828;
  Script local_820;
  undefined2 local_7e8;
  undefined1 local_7e6;
  string local_7e0 [32];
  undefined8 local_7c0;
  undefined4 local_7b8;
  undefined8 local_7b0;
  undefined4 local_7a8;
  Script local_7a0;
  undefined4 local_768;
  Script local_760;
  undefined2 local_728;
  undefined1 local_726;
  string local_720 [32];
  undefined8 local_700;
  undefined4 local_6f8;
  undefined8 local_6f0;
  undefined4 local_6e8;
  Script local_6e0;
  undefined4 local_6a8;
  Script local_6a0;
  undefined2 local_668;
  undefined1 local_666;
  string local_660 [32];
  undefined8 local_640;
  undefined4 local_638;
  undefined8 local_630;
  undefined4 local_628;
  Script local_620;
  undefined4 local_5e8;
  Script local_5e0;
  undefined2 local_5a8;
  undefined1 local_5a6;
  string local_5a0 [32];
  undefined8 local_580;
  undefined4 local_578;
  undefined8 local_570;
  undefined4 local_568;
  Script local_560;
  undefined4 local_528;
  Script local_520;
  undefined2 local_4e8;
  undefined1 local_4e6;
  string local_4e0 [32];
  undefined8 local_4c0;
  undefined4 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  Script local_4a0;
  undefined4 local_468;
  Script local_460;
  undefined2 local_428;
  undefined1 local_426;
  string local_420 [32];
  undefined8 local_400;
  undefined4 local_3f8;
  undefined8 local_3f0;
  undefined4 local_3e8;
  Script local_3e0;
  undefined4 local_3a8;
  Script local_3a0;
  undefined2 local_368;
  undefined1 local_366;
  string local_360 [32];
  undefined8 local_340;
  undefined4 local_338;
  undefined8 local_330;
  undefined4 local_328;
  Script local_320;
  undefined4 local_2e8;
  Script local_2e0;
  undefined2 local_2a8;
  undefined1 local_2a6;
  string local_2a0 [32];
  undefined8 local_280;
  undefined4 local_278;
  undefined8 local_270;
  undefined4 local_268;
  Script local_260;
  undefined4 local_228;
  Script local_220;
  undefined2 local_1e8;
  undefined1 local_1e6;
  string local_1e0 [32];
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a8;
  Script local_1a0;
  undefined4 local_168;
  Script local_160;
  undefined2 local_128;
  undefined1 local_126;
  string local_120 [32];
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  Script local_e0;
  undefined4 local_a8;
  Script local_a0;
  undefined2 local_68;
  undefined1 local_66;
  string local_60 [32];
  undefined8 local_40;
  undefined4 local_38;
  
  if ((TestBody()::multisig_script_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::multisig_script_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string
              ((string *)&TestBody()::multisig_script_abi_cxx11_,
               "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
               ,(allocator *)&script_template);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::multisig_script_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&TestBody()::multisig_script_abi_cxx11_);
  }
  if ((TestBody()::scriptsig_template_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::scriptsig_template_abi_cxx11_), iVar3 != 0)) {
    std::__cxx11::string::string
              ((string *)&TestBody()::scriptsig_template_abi_cxx11_,
               "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae"
               ,(allocator *)&script_template);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::scriptsig_template_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&TestBody()::scriptsig_template_abi_cxx11_);
  }
  if ((TestBody()::test_vector == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::test_vector), iVar3 != 0)) {
    script_template._vptr_Script = (_func_int **)0x9600000002;
    script_template.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    cfd::core::Script::Script
              ((Script *)
               &script_template.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish);
    cfd::core::Script::Script(&local_a60);
    local_a28._0_1_ = false;
    local_a28._1_1_ = false;
    local_a26 = false;
    std::__cxx11::string::string(local_a20,"",(allocator *)&local_b78);
    local_a00._0_4_ = 0;
    local_a00._4_4_ = 0;
    local_9f8 = 0;
    local_9f0 = 0xcd00000001;
    local_9e8 = 0;
    cfd::core::Script::Script(&local_9e0,&exp_script);
    local_9a8 = 0;
    cfd::core::Script::Script(&local_9a0);
    local_968 = 0;
    local_966 = 0;
    std::__cxx11::string::string(local_960,"",(allocator *)&local_b58);
    local_940 = 0;
    local_938 = 0;
    local_930 = 0xb000000006;
    local_928 = 0x70;
    cfd::core::Script::Script(&local_920);
    local_8e8 = 0;
    cfd::core::Script::Script(&local_8e0);
    local_8a8 = 0;
    local_8a6 = 0;
    std::__cxx11::string::string(local_8a0,"",(allocator *)&size);
    local_880 = 0;
    local_878 = 0;
    local_870 = 0xde00000005;
    local_868 = 0x92;
    std::__cxx11::string::string((string *)&gtest_ar,"51",(allocator *)&wit_size);
    cfd::core::Script::Script(&local_860,(string *)&gtest_ar);
    local_828 = 0;
    cfd::core::Script::Script(&local_820);
    local_7e8 = 0;
    local_7e6 = 0;
    std::__cxx11::string::string(local_7e0,"",(allocator *)&cache_size);
    local_7c0 = 0;
    local_7b8 = 0;
    local_7b0 = 0x9900000004;
    local_7a8 = 0x70;
    cfd::core::Script::Script(&local_7a0);
    local_768 = 0;
    cfd::core::Script::Script(&local_760);
    local_728 = 0;
    local_726 = 0;
    std::__cxx11::string::string(local_720,"",&local_b59);
    local_700 = 0;
    local_6f8 = 0;
    local_6f0 = 0xd000000003;
    local_6e8 = 0xa7;
    cfd::core::Script::Script(&local_6e0,&exp_script);
    local_6a8 = 0;
    cfd::core::Script::Script(&local_6a0);
    local_668 = 0;
    local_666 = 0;
    std::__cxx11::string::string(local_660,"",&local_b5a);
    local_640 = 0;
    local_638 = 0;
    local_630 = 0x12d00000003;
    local_628 = 0x104;
    cfd::core::Script::Script(&local_620,&TestBody()::multisig_script_abi_cxx11_);
    local_5e8 = 0;
    cfd::core::Script::Script(&local_5e0);
    local_5a8 = 0;
    local_5a6 = 0;
    std::__cxx11::string::string(local_5a0,"",&local_b5b);
    local_580 = 0;
    local_578 = 0;
    local_570 = 0xbf00000003;
    local_568 = 0x96;
    cfd::core::Script::Script(&local_560,&exp_script);
    local_528 = 0;
    cfd::core::Script::Script(&local_520);
    local_4e8 = 0;
    local_4e6 = 0;
    std::__cxx11::string::string(local_4e0,(string *)&TestBody()::scriptsig_template_abi_cxx11_);
    local_4c0 = 0;
    local_4b8 = 0;
    local_4b0 = 0x35c00000004;
    local_4a8 = 0x333;
    cfd::core::Script::Script(&local_4a0);
    local_468 = 0xe2;
    cfd::core::Script::Script(&local_460);
    local_428 = 0;
    local_426 = 0;
    std::__cxx11::string::string(local_420,"",&local_b5c);
    local_400 = 0;
    local_3f8 = 400;
    local_3f0 = 0xeb00000004;
    local_3e8 = 0x70;
    cfd::core::Script::Script(&local_3e0);
    local_3a8 = 0;
    cfd::core::Script::Script(&local_3a0);
    local_368 = 1;
    local_366 = 0;
    std::__cxx11::string::string(local_360,"",&local_b5d);
    local_340 = 0;
    local_338 = 0;
    local_330 = 0x213300000004;
    local_328 = 0x2088;
    cfd::core::Script::Script(&local_320);
    local_2e8 = 0;
    cfd::core::Script::Script(&local_2e0);
    local_2a8 = 0x101;
    local_2a6 = 0;
    std::__cxx11::string::string(local_2a0,"",&local_b5e);
    local_280 = 0x2400000000;
    local_278 = 0;
    local_270 = 0x21b300000004;
    local_268 = 0x2108;
    cfd::core::Script::Script(&local_260);
    local_228 = 0;
    cfd::core::Script::Script(&local_220);
    local_1e8 = 0x101;
    local_1e6 = 0;
    std::__cxx11::string::string(local_1e0,"",&local_b5f);
    local_1c0 = 0x3400000000;
    local_1b8 = 0;
    local_1b0 = 0x112700000004;
    local_1a8 = 0x107c;
    cfd::core::Script::Script(&local_1a0);
    local_168 = 0;
    cfd::core::Script::Script(&local_160);
    local_128 = 0x101;
    local_126 = 1;
    std::__cxx11::string::string(local_120,"",&local_b60);
    local_100 = 0x2400000000;
    local_f8 = 0;
    local_f0 = 0x116700000004;
    local_e8 = 0x10bc;
    cfd::core::Script::Script(&local_e0);
    local_a8 = 0;
    cfd::core::Script::Script(&local_a0);
    local_68 = 0x101;
    local_66 = 1;
    std::__cxx11::string::string(local_60,"",&local_b61);
    local_40 = 0x3400000000;
    local_38 = 0;
    __l._M_len = 0xe;
    __l._M_array = (iterator)&script_template;
    std::
    vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
    ::vector(&TestBody::test_vector,__l,&local_b62);
    lVar4 = 0x9c0;
    do {
      TestEstimateConfidentialTxInSizeVector::~TestEstimateConfidentialTxInSizeVector
                ((TestEstimateConfidentialTxInSizeVector *)
                 ((long)&script_template._vptr_Script + lVar4));
      lVar4 = lVar4 + -0xc0;
    } while (lVar4 != -0xc0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    __cxa_atexit(std::
                 vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
                 ::~vector,&TestBody::test_vector,&__dso_handle);
    __cxa_guard_release(&TestBody()::test_vector);
  }
  pTVar1 = TestBody::test_vector.
           super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar6 = TestBody::test_vector.
           super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pTVar6 == pTVar1) {
      return;
    }
    size = 0;
    wit_size = 0;
    cfd::core::Script::Script(&script_template,&pTVar6->script_template);
    scriptsig_template = (Script *)(pTVar6->script_template)._M_string_length;
    if (scriptsig_template != (Script *)0x0) {
      scriptsig_template = &script_template;
    }
    cache_size = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        addr_type = pTVar6->addr_type;
        cfd::core::Script::Script(&local_b20,&pTVar6->redeem_script);
        pegin_btc_tx_size = pTVar6->pegin_btc_tx;
        cfd::core::Script::Script(&local_ae8,&pTVar6->claim_script);
        size = cfd::core::ConfidentialTxIn::EstimateTxInSize
                         (addr_type,&local_b20,pegin_btc_tx_size,&local_ae8,pTVar6->is_issuance,
                          pTVar6->is_blind,&wit_size,(uint32_t *)0x0,pTVar6->is_reissuance,
                          scriptsig_template,pTVar6->exponent,pTVar6->minimum_bits,&cache_size,
                          pTVar6->txoutproof_size);
        cfd::core::Script::~Script(&local_ae8);
        cfd::core::Script::~Script(&local_b20);
      }
    }
    else {
      testing::Message::Message((Message *)&gtest_ar);
      testing::internal::AssertHelper::AssertHelper
                (&local_b78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x11c,
                 "Expected: (size = ConfidentialTxIn::EstimateTxInSize( test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx, test_data.claim_script, test_data.is_issuance, test_data.is_blind, &wit_size, nullptr, test_data.is_reissuance, template_ptr, test_data.exponent, test_data.minimum_bits, &cache_size, test_data.txoutproof_size)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=(&local_b78,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&local_b78);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"size","test_data.size",&size,&pTVar6->size);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_b78);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x11d,pcVar5);
      testing::internal::AssertHelper::operator=(&local_b58,(Message *)&local_b78);
      testing::internal::AssertHelper::~AssertHelper(&local_b58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_b78);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"wit_size","test_data.witness_size",&wit_size,
               &pTVar6->witness_size);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_b78);
      pcVar5 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x11e,pcVar5);
      testing::internal::AssertHelper::operator=(&local_b58,(Message *)&local_b78);
      testing::internal::AssertHelper::~AssertHelper(&local_b58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_b78);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    if (pTVar6->minimum_bits == 0x34) {
      local_b78.data_._0_4_ = 0x104d;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)&gtest_ar,"cache_size","4173",&cache_size,(int *)&local_b78);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b78);
        pcVar5 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x123,pcVar5);
        testing::internal::AssertHelper::operator=(&local_b58,(Message *)&local_b78);
        testing::internal::AssertHelper::~AssertHelper(&local_b58);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_b78);
      }
LAB_0030c74b:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    else if (pTVar6->minimum_bits == 0x24) {
      local_b78.data_._0_4_ = 0x100d;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)&gtest_ar,"cache_size","4109",&cache_size,(int *)&local_b78);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_b78);
        pcVar5 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x121,pcVar5);
        testing::internal::AssertHelper::operator=(&local_b58,(Message *)&local_b78);
        testing::internal::AssertHelper::~AssertHelper(&local_b58);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_b78);
      }
      goto LAB_0030c74b;
    }
    cfd::core::Script::~Script(&script_template);
    pTVar6 = pTVar6 + 1;
  } while( true );
}

Assistant:

TEST(ConfidentialTxIn, EstimateTxInSize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::string scriptsig_template = "00473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb014752210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec552ae";
  static const std::vector<TestEstimateConfidentialTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shAddress, 205, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wpkhAddress, 176, 112, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wshAddress, 222, 146, Script("51"), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 153, 112, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 208, 167, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 301, 260, Script(multisig_script), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 191, 150, exp_script, 0, Script(), false, false, false, scriptsig_template, 0, 0, 0},
    // pegin
    {AddressType::kP2wpkhAddress, 860, 819, Script(), 226, Script(), false, false, false, "", 0, 0, 400},
    // issue
    {AddressType::kP2wpkhAddress, 235, 112, Script(), 0, Script(), true, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 8499, 8328, Script(), 0, Script(), true, true, false,
        "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 8627, 8456, Script(), 0, Script(), true, true, false,
        "", 0, 52, 0},
    // reissue
    {AddressType::kP2wpkhAddress, 4391, 4220, Script(), 0, Script(), true, true, true,
        "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 4455, 4284, Script(), 0, Script(), true, true, true,
        "", 0, 52, 0},
  };

  for (const auto& test_data : test_vector) {
    uint32_t size = 0;
    uint32_t wit_size = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    uint32_t cache_size = 0;
    EXPECT_NO_THROW((size = ConfidentialTxIn::EstimateTxInSize(
        test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx,
        test_data.claim_script, test_data.is_issuance, test_data.is_blind,
        &wit_size, nullptr, test_data.is_reissuance, template_ptr,
        test_data.exponent, test_data.minimum_bits, &cache_size,
        test_data.txoutproof_size)));
    EXPECT_EQ(size, test_data.size);
    EXPECT_EQ(wit_size, test_data.witness_size);
    if (test_data.minimum_bits == 36) {
      // EXPECT_EQ(cache_size, 2892);
      EXPECT_EQ(cache_size, 4109);
    } else if (test_data.minimum_bits == 52) {
      EXPECT_EQ(cache_size, 4173);
    }
  }
}